

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ClipControlDepthModeOneToOneTest::deinit(ClipControlDepthModeOneToOneTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined1 local_28 [8];
  ClipControlApi cc;
  Functions *gl;
  ClipControlDepthModeOneToOneTest *this_local;
  
  ClipControlRenderBaseTest::deinit(&this->super_ClipControlRenderBaseTest);
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  cc.m_context = (Context *)CONCAT44(extraout_var,iVar2);
  bVar1 = ClipControlApi::Supported
                    ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                     super_TestCase.m_context,
                     (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  if (bVar1) {
    ClipControlApi::ClipControlApi
              ((ClipControlApi *)local_28,
               (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
               m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
    (*(code *)local_28)(0x8ca1,0x935e);
  }
  (*(code *)cc.m_context[0xe].m_renderCtx)(0);
  (*(code *)cc.m_context[0xe].m_testCtx)(0,0,0);
  (*(code *)cc.m_context[0x27].m_renderCtx)(0xb71);
  (*(code *)cc.m_context[0x25].m_testCtx)(0x201);
  if (this->m_vao != 0) {
    (*(code *)cc.m_context[0x24].m_contextInfo)(1,&this->m_vao);
  }
  if (this->m_vbo != 0) {
    (**(code **)&cc.m_context[0x21].m_contextType)(1,&this->m_vbo);
  }
  return;
}

Assistant:

void deinit()
	{
		ClipControlRenderBaseTest::deinit();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (ClipControlApi::Supported(m_context, m_api))
		{
			ClipControlApi cc(m_context, m_api);
			cc.clipControl(GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE);
		}

		gl.clearDepth(0.0);
		gl.clearColor(0.0, 0.0, 0.0, 0.0);

		gl.disable(GL_DEPTH_TEST);
		gl.depthFunc(GL_LESS);

		if (m_vao)
		{
			gl.deleteVertexArrays(1, &m_vao);
		}
		if (m_vbo)
		{
			gl.deleteBuffers(1, &m_vbo);
		}
	}